

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O0

string_view absl::lts_20250127::StripTrailingAsciiWhitespace(string_view str)

{
  size_type __n;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  string_view sVar2;
  undefined1 local_48 [16];
  basic_string_view<char,_std::char_traits<char>_> local_38;
  reverse_iterator<const_char_*> it;
  string_view str_local;
  
  it.current = (char *)str._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::rbegin(&local_38);
  std::basic_string_view<char,_std::char_traits<char>_>::rend
            ((basic_string_view<char,_std::char_traits<char>_> *)(local_48 + 8));
  std::find_if_not<std::reverse_iterator<char_const*>,bool(*)(unsigned_char)>
            ((reverse_iterator<const_char_*> *)&local_38._M_str,
             (reverse_iterator<const_char_*> *)&local_38,(_func_bool_uchar *)(local_48 + 8));
  std::basic_string_view<char,_std::char_traits<char>_>::rend
            ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
  __n = std::operator-((reverse_iterator<const_char_*> *)local_48,
                       (reverse_iterator<const_char_*> *)&local_38._M_str);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&it,0,__n);
  sVar2._M_len = bVar1._M_len;
  sVar2._M_str = bVar1._M_str;
  return sVar2;
}

Assistant:

ABSL_MUST_USE_RESULT inline absl::string_view StripTrailingAsciiWhitespace(
    absl::string_view str) {
  auto it = std::find_if_not(str.rbegin(), str.rend(), absl::ascii_isspace);
  return str.substr(0, static_cast<size_t>(str.rend() - it));
}